

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O3

Intersectors * __thiscall
embree::BVH8Factory::BVH8Quad4iIntersectors
          (Intersectors *__return_storage_ptr__,BVH8Factory *this,BVH8 *bvh,
          IntersectVariant ivariant)

{
  char **__s;
  Intersector16 local_30;
  
  __s = &(__return_storage_ptr__->intersector1).name;
  if (ivariant == ROBUST) {
    (__return_storage_ptr__->collider).name = (char *)0x0;
    (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
    __return_storage_ptr__->leafIntersector = (void *)0x0;
    (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
    (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
    memset(__s,0,0xe0);
    __return_storage_ptr__->ptr = &bvh->super_AccelData;
    (*this->BVH8Quad4iIntersector1Pluecker)(&__return_storage_ptr__->intersector1);
    (*this->BVH8Quad4iIntersector4HybridPluecker)((Intersector4 *)&local_30);
    (__return_storage_ptr__->intersector4).name = local_30.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_30.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_30.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_30.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_30.occluded._4_4_;
    (*this->BVH8Quad4iIntersector8HybridPluecker)((Intersector8 *)&local_30);
    (__return_storage_ptr__->intersector8).name = local_30.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_30.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_30.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_30.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_30.occluded._4_4_;
    (*this->BVH8Quad4iIntersector16HybridPluecker)(&local_30);
  }
  else {
    if (ivariant != FAST) {
      (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
      (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
      (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
      (__return_storage_ptr__->collider).name = (char *)0x0;
      __return_storage_ptr__->ptr = (AccelData *)0x0;
      __return_storage_ptr__->leafIntersector = (void *)0x0;
      memset(__s,0,0xe0);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->collider).name = (char *)0x0;
    (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
    __return_storage_ptr__->leafIntersector = (void *)0x0;
    (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
    (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
    memset(__s,0,0xe0);
    __return_storage_ptr__->ptr = &bvh->super_AccelData;
    (*this->BVH8Quad4iIntersector1Moeller)(&__return_storage_ptr__->intersector1);
    (*this->BVH8Quad4iIntersector4HybridMoeller)((Intersector4 *)&local_30);
    (__return_storage_ptr__->intersector4).name = local_30.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_30.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_30.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_30.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_30.occluded._4_4_;
    (*this->BVH8Quad4iIntersector8HybridMoeller)((Intersector8 *)&local_30);
    (__return_storage_ptr__->intersector8).name = local_30.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_30.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_30.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_30.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_30.occluded._4_4_;
    (*this->BVH8Quad4iIntersector16HybridMoeller)(&local_30);
  }
  (__return_storage_ptr__->intersector16).name = local_30.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_30.intersect._4_4_,local_30.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_30.occluded._4_4_,local_30.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH8Factory::BVH8Quad4iIntersectors(BVH8* bvh, IntersectVariant ivariant)
  {
    switch (ivariant) {
    case IntersectVariant::FAST:
    {
      Accel::Intersectors intersectors;
      intersectors.ptr = bvh;
      intersectors.intersector1  = BVH8Quad4iIntersector1Moeller();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8Quad4iIntersector4HybridMoeller();
      intersectors.intersector8  = BVH8Quad4iIntersector8HybridMoeller();
      intersectors.intersector16 = BVH8Quad4iIntersector16HybridMoeller();
#endif
      return intersectors;
    }
    case IntersectVariant::ROBUST:
    {
      Accel::Intersectors intersectors;
      intersectors.ptr = bvh;
      intersectors.intersector1  = BVH8Quad4iIntersector1Pluecker();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8Quad4iIntersector4HybridPluecker();
      intersectors.intersector8  = BVH8Quad4iIntersector8HybridPluecker();
      intersectors.intersector16 = BVH8Quad4iIntersector16HybridPluecker();
#endif
      return intersectors;
    }
    }
    return Accel::Intersectors();
  }